

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.h
# Opt level: O3

void __thiscall
Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::addNeighbor
          (Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data,int index)

{
  SinglyLinkedList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pSVar1;
  int iVar2;
  pointer pcVar3;
  node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pnVar4;
  long *local_48 [2];
  long local_38 [2];
  
  pnVar4 = (node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
           )operator_new(0x28);
  (pnVar4->data)._M_dataplus._M_p = (pointer)&(pnVar4->data).field_2;
  (pnVar4->data)._M_string_length = 0;
  (pnVar4->data).field_2._M_local_buf[0] = '\0';
  pnVar4->next = (node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x0;
  pcVar3 = (data->_M_dataplus)._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar3,pcVar3 + data->_M_string_length);
  std::__cxx11::string::_M_assign((string *)pnVar4);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  pSVar1 = this->adjacencyList + index;
  iVar2 = pSVar1->count;
  if (iVar2 == 0) {
    pSVar1->tail = pnVar4;
  }
  else {
    pnVar4->next = pSVar1->head;
  }
  pSVar1->head = pnVar4;
  pSVar1->count = iVar2 + 1;
  return;
}

Assistant:

void Graph<T>::addNeighbor(T data, int index)
{
  node<T>* newNode = new node<T>();
  newNode -> setData(data);
  adjacencyList[index].add(newNode);
}